

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.h
# Opt level: O1

double __thiscall HighsPseudocost::getScore(HighsPseudocost *this,HighsInt col,double frac)

{
  pointer piVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  piVar1 = (this->nsamplesdown).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->pseudocostup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + col;
  if ((this->nsamplesup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[col] == 0) {
    pdVar2 = &this->cost_total;
  }
  dVar3 = ceil(frac);
  dVar5 = *pdVar2;
  pdVar2 = (this->pseudocostdown).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + col;
  if (piVar1[col] == 0) {
    pdVar2 = &this->cost_total;
  }
  dVar4 = floor(frac);
  dVar5 = getScore(this,col,(dVar3 - frac) * dVar5,(frac - dVar4) * *pdVar2);
  return dVar5;
}

Assistant:

double getScore(HighsInt col, double frac) const {
    double upcost = getPseudocostUp(col, frac);
    double downcost = getPseudocostDown(col, frac);

    return getScore(col, upcost, downcost);
  }